

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_examples.cpp
# Opt level: O0

void density_tests::
     SpQueueSamples<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1>::
     spinlocking_heterogeneous_queue_reentrant_consume_operation_samples(void)

{
  bool bVar1;
  bool bVar2;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *psVar3;
  runtime_type<> *prVar4;
  void *pvVar5;
  int *piVar6;
  int *piVar7;
  ostream *poVar8;
  reentrant_consume_operation consume_13;
  SpQueue queue_12;
  int *element_ptr;
  void *unaligned_ptr;
  bool is_overaligned;
  reentrant_consume_operation consume_12;
  SpQueue queue_11;
  reentrant_consume_operation consume_11;
  SpQueue queue_10;
  reentrant_consume_operation consume_10;
  SpQueue queue_9;
  reentrant_consume_operation consume_9;
  SpQueue queue_8;
  reentrant_consume_operation consume_2;
  reentrant_consume_operation consume_1_2;
  SpQueue queue_7;
  reentrant_consume_operation consume_8;
  SpQueue queue_6;
  reentrant_consume_operation consume_7;
  SpQueue queue_5;
  reentrant_consume_operation consume_6;
  SpQueue queue_4;
  reentrant_consume_operation consume_5;
  SpQueue queue_3;
  SpQueue queue_2;
  reentrant_consume_operation consume_1_1;
  reentrant_consume_operation consume_4;
  SpQueue queue_1;
  type consume_1;
  reentrant_consume_operation consume_3;
  SpQueue queue;
  reentrant_consume_operation consume;
  byte local_aa9;
  reentrant_consume_operation local_aa0;
  int local_a84;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_a80;
  int *local_9f8;
  int *local_9f0;
  undefined1 local_9e1;
  reentrant_consume_operation local_9e0;
  int local_9c4;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_9c0;
  reentrant_consume_operation local_920;
  int local_904;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_900;
  runtime_type<> local_868;
  reentrant_consume_operation local_860;
  int local_844;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_840;
  reentrant_consume_operation local_7b8;
  reentrant_consume_operation local_7a0;
  int local_784;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_780;
  runtime_type<> local_700;
  reentrant_consume_operation local_6f8;
  reentrant_consume_operation local_6e0;
  int local_6c4;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_6c0;
  reentrant_consume_operation local_618;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_600;
  reentrant_consume_operation local_578;
  reentrant_consume_operation local_560;
  int local_544;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_540;
  reentrant_consume_operation local_4b8;
  reentrant_consume_operation local_4a0;
  int local_484;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_480;
  reentrant_consume_operation local_3f8;
  reentrant_consume_operation local_3e0;
  int local_3c4;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_3c0;
  reentrant_consume_operation local_320;
  int local_304;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_300;
  reentrant_consume_operation local_250;
  reentrant_consume_operation local_238;
  reentrant_consume_operation local_220;
  int local_208 [2];
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_200;
  reentrant_consume_operation local_148;
  reentrant_consume_operation local_130;
  int local_104;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_100;
  reentrant_consume_operation local_68 [4];
  
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::reentrant_consume_operation(local_68);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(local_68);
  if (!bVar1) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x69f,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(local_68);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_100);
  local_104 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_100,&local_104);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_130,&local_100);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::reentrant_consume_operation(&local_148,&local_130);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_130);
  local_aa9 = 0;
  if (bVar1) {
    bVar1 = density::
            sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
            ::reentrant_consume_operation::empty(&local_148);
    local_aa9 = bVar1 ^ 0xff;
  }
  if ((local_aa9 & 1) == 0) {
    __assert_fail("consume.empty() && !consume_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x6bc,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::commit(&local_148);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_148);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_130);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_100);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_200);
  local_208[1] = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_200,local_208 + 1);
  local_208[0] = 0x2b;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_200,local_208);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_220,&local_200);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::cancel(&local_220);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::reentrant_consume_operation(&local_238);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_250,&local_200);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::operator=(&local_220,&local_250);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_250);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::operator=(&local_238,&local_220);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_220);
  if (!bVar1) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x6cf,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_238);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!consume_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x6d0,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::commit(&local_238);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_238);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_220);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_200);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_300);
  local_304 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_300,&local_304);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_320,&local_300);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_320);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_300);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_3c0);
  local_3c4 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_3c0,&local_3c4);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::reentrant_consume_operation(&local_3e0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_3e0);
  if (!bVar1) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x6e9,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_3f8,&local_3c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::operator=(&local_3e0,&local_3f8);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_3f8);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_3e0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x6eb,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_3e0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_3c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_480);
  local_484 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_480,&local_484);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::reentrant_consume_operation(&local_4a0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_4a0);
  bVar2 = density::sp_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)&local_4a0);
  if (bVar1 != (bool)((bVar2 ^ 0xffU) & 1)) {
    __assert_fail("consume.empty() == !consume",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x6f7,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_4b8,&local_480);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::operator=(&local_4a0,&local_4b8);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_4b8);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_4a0);
  bVar2 = density::sp_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)&local_4a0);
  if (bVar1 != (bool)((bVar2 ^ 0xffU) & 1)) {
    __assert_fail("consume.empty() == !consume",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x6f9,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_4a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_480);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_540);
  local_544 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_540,&local_544);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::reentrant_consume_operation(&local_560);
  bVar2 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_560);
  bVar1 = false;
  if (bVar2) {
    bVar2 = density::sp_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                      ((reentrant_consume_operation *)&local_560);
    bVar1 = false;
    if (!bVar2) {
      psVar3 = density::
               sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
               ::reentrant_consume_operation::queue(&local_560);
      bVar1 = psVar3 == (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                         *)0x0;
    }
  }
  if (!bVar1) {
    __assert_fail("consume.empty() && !consume && consume.queue() == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x705,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_578,&local_540);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::operator=(&local_560,&local_578);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_578);
  bVar2 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_consume_operation::empty(&local_560);
  bVar1 = false;
  if (!bVar2) {
    bVar2 = density::sp_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                      ((reentrant_consume_operation *)&local_560);
    bVar1 = false;
    if (bVar2) {
      psVar3 = density::
               sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
               ::reentrant_consume_operation::queue(&local_560);
      bVar1 = psVar3 == &local_540;
    }
  }
  if (!bVar1) {
    __assert_fail("!consume.empty() && !!consume && consume.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x707,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_560);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_540);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_600);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::emplace<std::__cxx11::string,char_const(&)[4]>
            ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_600,(char (*) [4])"abc");
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_618,&local_600);
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::complete_type(&local_618);
  pvVar5 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::element_ptr(&local_618);
  density::runtime_type<>::destroy(prVar4,pvVar5);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::commit_nodestroy(&local_618);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_618);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_600);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_6c0);
  local_6c4 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_6c0,&local_6c4);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_6e0,&local_6c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::reentrant_consume_operation(&local_6f8);
  density::swap(&local_6e0,&local_6f8);
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::complete_type(&local_6f8);
  bVar1 = density::runtime_type<>::is<int>(prVar4);
  if (!bVar1) {
    __assert_fail("consume_2.complete_type().template is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x728,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::complete_type(&local_6f8);
  local_700 = density::runtime_type<>::make<int>();
  bVar1 = density::runtime_type<>::operator==(prVar4,&local_700);
  if (!bVar1) {
    __assert_fail("consume_2.complete_type() == runtime_type<>::make<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x72a,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  piVar6 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::element<int>(&local_6f8);
  if (*piVar6 != 0x2a) {
    __assert_fail("consume_2.template element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x72b,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::commit(&local_6f8);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty(&local_6c0);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x72e,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_6f8);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_6e0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_6c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_780);
  local_784 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_780,&local_784);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_7a0,&local_780);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::cancel(&local_7a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_7b8,&local_780);
  piVar6 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::element<int>(&local_7b8);
  if (*piVar6 != 0x2a) {
    __assert_fail("queue.try_start_reentrant_consume().template element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x73e,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_7b8);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_7a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_780);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_840);
  local_844 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_840,&local_844);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_860,&local_840);
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::complete_type(&local_860);
  bVar1 = density::runtime_type<>::is<int>(prVar4);
  if (!bVar1) {
    __assert_fail("consume.complete_type().template is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x74a,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::complete_type(&local_860);
  local_868 = density::runtime_type<>::make<int>();
  bVar1 = density::runtime_type<>::operator==(prVar4,&local_868);
  if (!bVar1) {
    __assert_fail("consume.complete_type() == runtime_type<>::make<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x74c,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::commit(&local_860);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty(&local_840);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x74f,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_860);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_840);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_900);
  local_904 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_900,&local_904);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_920,&local_900);
  piVar6 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::reentrant_consume_operation::element_ptr(&local_920);
  *piVar6 = *piVar6 + 1;
  piVar6 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::element<int>(&local_920);
  if (*piVar6 != 0x2b) {
    __assert_fail("consume.template element<int>() == 43",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x75c,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::commit(&local_920);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_920);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_900);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_9c0);
  local_9c4 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_9c0,&local_9c4);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_9e0,&local_9c0);
  local_9e1 = 0;
  piVar6 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::reentrant_consume_operation::unaligned_element_ptr(&local_9e0);
  local_9f0 = piVar6;
  piVar7 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::reentrant_consume_operation::element_ptr(&local_9e0);
  if (piVar6 != piVar7) {
    __assert_fail("unaligned_ptr == consume.element_ptr()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x772,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_9f8 = local_9f0;
  bVar1 = density::address_is_aligned(local_9f0,4);
  if (!bVar1) {
    __assert_fail("address_is_aligned(element_ptr, alignof(int))",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x775,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"An int: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar8,*local_9f8);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::commit(&local_9e0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_9e0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_9c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_a80);
  local_a84 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::push<int>(&local_a80,&local_a84);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_aa0,&local_a80);
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::complete_type(&local_aa0);
  bVar1 = density::runtime_type<>::is<int>(prVar4);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,"An int: ");
    piVar6 = density::
             sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
             ::reentrant_consume_operation::element<int>(&local_aa0);
    pvVar5 = (void *)std::ostream::operator<<(poVar8,*piVar6);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_consume_operation::commit(&local_aa0);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_aa0);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_heter_queue(&local_a80);
    return;
  }
  __assert_fail("consume.complete_type().template is<int>()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                ,0x783,
                "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
               );
}

Assistant:

static void spinlocking_heterogeneous_queue_reentrant_consume_operation_samples()
{
    using namespace density;

    {
        //! [sp_heter_queue reentrant_consume_operation default_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        typename SpQueue::reentrant_consume_operation consume;
        assert(consume.empty());
        //! [sp_heter_queue reentrant_consume_operation default_construct example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation copy_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        static_assert(
          !std::is_copy_constructible<typename SpQueue::reentrant_consume_operation>::value, "");
        //! [sp_heter_queue reentrant_consume_operation copy_construct example 1]

        //! [sp_heter_queue reentrant_consume_operation copy_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        static_assert(
          !std::is_copy_assignable<typename SpQueue::reentrant_consume_operation>::value, "");
        //! [sp_heter_queue reentrant_consume_operation copy_assign example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation move_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        queue.push(42);
        auto consume = queue.try_start_reentrant_consume();

        auto consume_1 = std::move(consume);
        assert(consume.empty() && !consume_1.empty());
        consume_1.commit();
        //! [sp_heter_queue reentrant_consume_operation move_construct example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation move_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        queue.push(42);
        queue.push(43);
        auto consume = queue.try_start_reentrant_consume();
        consume.cancel();

        typename SpQueue::reentrant_consume_operation consume_1;
        consume   = queue.try_start_reentrant_consume();
        consume_1 = std::move(consume);
        assert(consume.empty());
        assert(!consume_1.empty());
        consume_1.commit();
        //! [sp_heter_queue reentrant_consume_operation move_assign example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation destroy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        // this consumed is started and destroyed before being committed, so it has no observable effects
        queue.try_start_reentrant_consume();
        //! [sp_heter_queue reentrant_consume_operation destroy example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation empty example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume;
        assert(consume.empty());
        consume = queue.try_start_reentrant_consume();
        assert(!consume.empty());
        //! [sp_heter_queue reentrant_consume_operation empty example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation operator_bool example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume;
        assert(consume.empty() == !consume);
        consume = queue.try_start_reentrant_consume();
        assert(consume.empty() == !consume);
        //! [sp_heter_queue reentrant_consume_operation operator_bool example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation queue example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume;
        assert(consume.empty() && !consume && consume.queue() == nullptr);
        consume = queue.try_start_reentrant_consume();
        assert(!consume.empty() && !!consume && consume.queue() == &queue);
        //! [sp_heter_queue reentrant_consume_operation queue example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation commit_nodestroy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.template emplace<std::string>("abc");

        typename SpQueue::reentrant_consume_operation consume = queue.try_start_reentrant_consume();
        consume.complete_type().destroy(consume.element_ptr());

        // the string has already been destroyed. Calling commit would trigger an undefined behavior
        consume.commit_nodestroy();
        //! [sp_heter_queue reentrant_consume_operation commit_nodestroy example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation swap example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume_1 =
          queue.try_start_reentrant_consume();
        typename SpQueue::reentrant_consume_operation consume_2;
        {
            using namespace std;
            swap(consume_1, consume_2);
        }
        assert(consume_2.complete_type().template is<int>());
        assert(
          consume_2.complete_type() == runtime_type<>::make<int>()); // same to the previous assert
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();

        assert(queue.empty());
        //! [sp_heter_queue reentrant_consume_operation swap example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation cancel example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume = queue.try_start_reentrant_consume();
        consume.cancel();

        // there is still a 42 in the queue
        assert(queue.try_start_reentrant_consume().template element<int>() == 42);
        //! [sp_heter_queue reentrant_consume_operation cancel example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation complete_type example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume = queue.try_start_reentrant_consume();
        assert(consume.complete_type().template is<int>());
        assert(
          consume.complete_type() == runtime_type<>::make<int>()); // same to the previous assert
        consume.commit();

        assert(queue.empty());
        //! [sp_heter_queue reentrant_consume_operation complete_type example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation element_ptr example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume = queue.try_start_reentrant_consume();
        ++*static_cast<int *>(consume.element_ptr());
        assert(consume.template element<int>() == 43);
        consume.commit();
        //! [sp_heter_queue reentrant_consume_operation element_ptr example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation unaligned_element_ptr example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume = queue.try_start_reentrant_consume();
        bool const   is_overaligned = alignof(int) > SpQueue::min_alignment;
        void * const unaligned_ptr  = consume.unaligned_element_ptr();
        int *        element_ptr;
        if (is_overaligned)
        {
            element_ptr = static_cast<int *>(address_upper_align(unaligned_ptr, alignof(int)));
        }
        else
        {
            assert(unaligned_ptr == consume.element_ptr());
            element_ptr = static_cast<int *>(unaligned_ptr);
        }
        assert(address_is_aligned(element_ptr, alignof(int)));
        std::cout << "An int: " << *element_ptr << std::endl;
        consume.commit();
        //! [sp_heter_queue reentrant_consume_operation unaligned_element_ptr example 1]
    }
    {
        //! [sp_heter_queue reentrant_consume_operation element example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::reentrant_consume_operation consume = queue.try_start_reentrant_consume();
        assert(consume.complete_type().template is<int>());
        std::cout << "An int: " << consume.template element<int>() << std::endl;
        /* std::cout << "An float: " << consume.element<float>() << std::endl; this would
                trigger an undefined behavior, because the element is not a float */
        consume.commit();
        //! [sp_heter_queue reentrant_consume_operation element example 1]
    }
}